

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

TimingCheckArgSyntax * __thiscall slang::parsing::Parser::parseTimingCheckArg(Parser *this)

{
  bool bVar1;
  int iVar2;
  EmptyTimingCheckArgSyntax *pEVar3;
  SourceLocation SVar4;
  ExpressionTimingCheckArgSyntax *pEVar5;
  EdgeDescriptorSyntax *pEVar6;
  undefined4 extraout_var;
  EdgeControlSpecifierSyntax *controlSpecifier;
  SyntaxNode *this_00;
  Diagnostic *pDVar8;
  NameSyntax *expr;
  TimingCheckEventConditionSyntax *condition;
  TimingCheckEventArgSyntax *pTVar9;
  Info *pIVar10;
  Info *pIVar11;
  Info *extraout_RDX;
  ulong extraout_RDX_00;
  BumpAllocator *dst;
  TokenKind TVar12;
  ulong uVar13;
  TokenKind TVar14;
  Token TVar15;
  Token TVar16;
  SourceRange SVar17;
  string_view arg;
  Token edge_00;
  Token closeBracket;
  Token edge;
  anon_class_8_1_8991fb9c parseCondition;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_210;
  undefined1 local_200;
  Token openBracket;
  Token current;
  Token local_1d8;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> local_1c8 [7];
  pointer pTVar7;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis), bVar1)) {
    TVar15 = ParserBase::placeholderToken(&this->super_ParserBase);
    pEVar3 = slang::syntax::SyntaxFactory::emptyTimingCheckArg(&this->factory,TVar15);
    return &pEVar3->super_TimingCheckArgSyntax;
  }
  parseCondition.this = this;
  edge = parseEdgeKeyword(this);
  if (edge.info == (Info *)0x0) {
    expr = (NameSyntax *)
           parseMinTypMaxExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    condition = parseTimingCheckArg::anon_class_8_1_8991fb9c::operator()(&parseCondition);
    if (condition == (TimingCheckEventConditionSyntax *)0x0) {
      pEVar5 = slang::syntax::SyntaxFactory::expressionTimingCheckArg
                         (&this->factory,(ExpressionSyntax *)expr);
      return &pEVar5->super_TimingCheckArgSyntax;
    }
    Token::Token(&local_1d8);
    controlSpecifier = (EdgeControlSpecifierSyntax *)0x0;
    goto LAB_003e7446;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
  if (bVar1) {
    Token::Token(&openBracket);
    Token::Token(&closeBracket);
    openBracket = ParserBase::expect(&this->super_ParserBase,OpenBracket);
    if ((openBracket._0_4_ >> 0x10 & 1) == 0) {
      local_1c8[0].super_SyntaxListBase.super_SyntaxNode._0_8_ = 0;
      local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase =
           (_func_int **)((long)local_1c8 + 0x18);
      local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
      TVar15 = ParserBase::peek(&this->super_ParserBase);
      current = TVar15;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfBracketedList(TVar15.kind);
      if (bVar1) {
        bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
        if (!bVar1) {
          SVar4 = Token::location(&current);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x3a0005,SVar4);
        }
LAB_003e7110:
        closeBracket = ParserBase::expect(&this->super_ParserBase,CloseBracket);
        pIVar10 = closeBracket.info;
      }
      else {
        bVar1 = slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor(TVar15.kind);
        if (bVar1) {
          do {
            do {
              pIVar10 = TVar15.info;
              pEVar6 = parseEdgeDescriptor(this);
              local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar6;
              local_200 = 1;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (TokenOrSyntax *)&local_210._M_first);
              TVar16 = ParserBase::peek(&this->super_ParserBase);
              TVar14 = TVar16.kind;
              bVar1 = slang::syntax::SyntaxFacts::isEndOfBracketedList(TVar14);
              if (TVar14 == EndOfFile || bVar1) goto LAB_003e7110;
              if (TVar14 != Comma) {
                ParserBase::expect(&this->super_ParserBase,Comma);
                do {
                  bVar1 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor,&slang::syntax::SyntaxFacts::isEndOfBracketedList>
                                    (&this->super_ParserBase,(DiagCode)0x3a0005,false);
                  if (!bVar1) goto LAB_003e7110;
                  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
                } while (!bVar1);
              }
              local_210._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   ParserBase::expect(&this->super_ParserBase,Comma);
              local_200 = 0;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (TokenOrSyntax *)&local_210._M_first);
              TVar16 = ParserBase::peek(&this->super_ParserBase);
              pIVar11 = TVar16.info;
              TVar14 = TVar16.kind;
              bVar1 = slang::syntax::SyntaxFacts::isEndOfBracketedList(TVar14);
              if (TVar14 == EndOfFile || bVar1) {
                ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                goto LAB_003e7110;
              }
              TVar12 = TVar15.kind;
              uVar13 = TVar16._0_8_ & 0xffffffff;
              TVar15.info = pIVar11;
              TVar15.kind = (short)uVar13;
              TVar15._2_1_ = (char)(uVar13 >> 0x10);
              TVar15.numFlags.raw = (char)(uVar13 >> 0x18);
              TVar15.rawLen = (int)(uVar13 >> 0x20);
            } while (pIVar10 != pIVar11 || TVar12 != TVar14);
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor,&slang::syntax::SyntaxFacts::isEndOfBracketedList>
                              (&this->super_ParserBase,(DiagCode)0x3a0005,true);
            uVar13 = TVar16._0_8_ & 0xffffffff;
            TVar15.kind = (short)uVar13;
            TVar15._2_1_ = (char)(uVar13 >> 0x10);
            TVar15.numFlags.raw = (char)(uVar13 >> 0x18);
            TVar15.rawLen = (int)(uVar13 >> 0x20);
          } while (bVar1);
          goto LAB_003e7110;
        }
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar15,CloseBracket,&closeBracket,(DiagCode)0x3a0005);
        pIVar10 = extraout_RDX;
      }
      dst = (this->super_ParserBase).alloc;
      iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)pIVar10);
      pTVar7 = (pointer)CONCAT44(extraout_var,iVar2);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst);
      uVar13 = extraout_RDX_00;
    }
    else {
      SVar4 = Token::location(&openBracket);
      closeBracket = ParserBase::missingToken(&this->super_ParserBase,CloseBracket,SVar4);
      uVar13 = 0;
      pTVar7 = (pointer)0x0;
    }
    local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = 3;
    local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006797d8;
    local_1c8[0].super_SyntaxListBase.childCount = uVar13;
    local_1c8[0].elements._M_ptr = pTVar7;
    local_1c8[0].elements._M_extent._M_extent_value = uVar13;
    controlSpecifier =
         slang::syntax::SyntaxFactory::edgeControlSpecifier
                   (&this->factory,openBracket,local_1c8,closeBracket);
    if (0xb < uVar13) {
      if (*(__index_type *)
           ((long)&pTVar7[0xb].super_ConstTokenOrSyntax.
                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .
                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
           + 0x10) == '\x01') {
        this_00 = slang::syntax::TokenOrSyntax::node(pTVar7 + 0xb);
        SVar17 = slang::syntax::SyntaxNode::sourceRange(this_00);
      }
      else {
        local_1c8[0].super_SyntaxListBase._0_16_ =
             (undefined1  [16])
             slang::syntax::ConstTokenOrSyntax::token(&pTVar7[0xb].super_ConstTokenOrSyntax);
        SVar17 = Token::range((Token *)local_1c8);
      }
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa90005,SVar17);
    }
    if (edge.kind != EdgeKeyword) {
      SVar17 = Token::range(&edge);
      pDVar8 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x280005,SVar17);
      arg = Token::valueText(&edge);
      pDVar8 = Diagnostic::operator<<(pDVar8,arg);
      SVar17 = slang::syntax::SyntaxNode::sourceRange(&controlSpecifier->super_SyntaxNode);
      Diagnostic::operator<<(pDVar8,SVar17);
    }
  }
  else {
    controlSpecifier = (EdgeControlSpecifierSyntax *)0x0;
  }
  expr = parseName(this);
  condition = parseTimingCheckArg::anon_class_8_1_8991fb9c::operator()(&parseCondition);
  local_1d8.info = edge.info;
  local_1d8._0_8_ = edge._0_8_;
LAB_003e7446:
  edge_00.info = local_1d8.info;
  edge_00.kind = local_1d8.kind;
  edge_00._2_1_ = local_1d8._2_1_;
  edge_00.numFlags.raw = local_1d8.numFlags.raw;
  edge_00.rawLen = local_1d8.rawLen;
  pTVar9 = slang::syntax::SyntaxFactory::timingCheckEventArg
                     (&this->factory,edge_00,controlSpecifier,&expr->super_ExpressionSyntax,
                      condition);
  return &pTVar9->super_TimingCheckArgSyntax;
}

Assistant:

TimingCheckArgSyntax& Parser::parseTimingCheckArg() {
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyTimingCheckArg(placeholderToken());

    auto parseCondition = [&]() -> TimingCheckEventConditionSyntax* {
        if (!peek(TokenKind::TripleAnd))
            return nullptr;

        // The syntax in the BNF for condition expressions is nonsensical,
        // and there is some discussion in the Mantis tracker about how it's
        // a holdover from Verilog-XL and should likely be replaced with just
        // a plain old expression, so that's what we're doing here.
        auto tripleAnd = consume();
        auto& expr = parseExpression();
        return &factory.timingCheckEventCondition(tripleAnd, expr);
    };

    auto edge = parseEdgeKeyword();
    if (edge) {
        EdgeControlSpecifierSyntax* control = nullptr;
        if (peek(TokenKind::OpenBracket)) {
            Token openBracket, closeBracket;
            std::span<TokenOrSyntax> list;
            parseList<isPossibleEdgeDescriptor, isEndOfBracketedList>(
                TokenKind::OpenBracket, TokenKind::CloseBracket, TokenKind::Comma, openBracket,
                list, closeBracket, RequireItems::True, diag::ExpectedEdgeDescriptor,
                [this] { return &parseEdgeDescriptor(); });

            control = &factory.edgeControlSpecifier(openBracket, list, closeBracket);

            // List is allowed to have up to 6 specifiers (plus 5 commas)
            if (list.size() > 11) {
                auto& lastDesc = list[11];
                auto range = lastDesc.isNode() ? lastDesc.node()->sourceRange()
                                               : lastDesc.token().range();
                addDiag(diag::TooManyEdgeDescriptors, range);
            }

            if (edge.kind != TokenKind::EdgeKeyword) {
                addDiag(diag::EdgeDescWrongKeyword, edge.range())
                    << edge.valueText() << control->sourceRange();
            }
        }

        auto& terminal = parseName();
        auto cond = parseCondition();
        return factory.timingCheckEventArg(edge, control, terminal, cond);
    }

    auto& expr = parseMinTypMaxExpression();
    auto cond = parseCondition();
    if (cond)
        return factory.timingCheckEventArg(Token(), nullptr, expr, cond);

    else
        return factory.expressionTimingCheckArg(expr);
}